

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void pnga_median(Integer g_a,Integer g_b,Integer g_c,Integer g_m)

{
  long lVar1;
  Integer *pIVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Integer mndim;
  Integer cndim;
  Integer bndim;
  Integer andim;
  Integer mtype;
  Integer ctype;
  Integer btype;
  Integer atype;
  Integer mlo [7];
  Integer chi [7];
  Integer clo [7];
  Integer bhi [7];
  Integer blo [7];
  Integer ahi [7];
  Integer alo [7];
  Integer mhi [7];
  
  pnga_inquire(g_a,&atype,&andim,ahi);
  pnga_inquire(g_b,&btype,&bndim,bhi);
  pnga_inquire(g_c,&ctype,&cndim,chi);
  pnga_inquire(g_m,&mtype,&mndim,mhi);
  if (andim != 0) {
    lVar1 = andim + -1;
    auVar4._8_4_ = (int)lVar1;
    auVar4._0_8_ = lVar1;
    auVar4._12_4_ = (int)((ulong)lVar1 >> 0x20);
    pIVar2 = alo + andim + -1;
    uVar3 = 0;
    auVar4 = auVar4 ^ _DAT_0020b020;
    do {
      auVar8._8_4_ = (int)uVar3;
      auVar8._0_8_ = uVar3;
      auVar8._12_4_ = (int)(uVar3 >> 0x20);
      auVar8 = (auVar8 | _DAT_0020b040) ^ _DAT_0020b020;
      if ((bool)(~(auVar8._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar8._0_4_ ||
                  auVar4._4_4_ < auVar8._4_4_) & 1)) {
        *pIVar2 = 1;
      }
      if ((auVar8._12_4_ != auVar4._12_4_ || auVar8._8_4_ <= auVar4._8_4_) &&
          auVar8._12_4_ <= auVar4._12_4_) {
        pIVar2[-1] = 1;
      }
      uVar3 = uVar3 + 2;
      pIVar2 = pIVar2 + -2;
    } while ((andim + 1U & 0xfffffffffffffffe) != uVar3);
    andim = 0;
  }
  if (bndim != 0) {
    lVar1 = bndim + -1;
    auVar5._8_4_ = (int)lVar1;
    auVar5._0_8_ = lVar1;
    auVar5._12_4_ = (int)((ulong)lVar1 >> 0x20);
    pIVar2 = blo + bndim + -1;
    uVar3 = 0;
    auVar5 = auVar5 ^ _DAT_0020b020;
    do {
      auVar9._8_4_ = (int)uVar3;
      auVar9._0_8_ = uVar3;
      auVar9._12_4_ = (int)(uVar3 >> 0x20);
      auVar4 = (auVar9 | _DAT_0020b040) ^ _DAT_0020b020;
      if ((bool)(~(auVar4._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar4._0_4_ ||
                  auVar5._4_4_ < auVar4._4_4_) & 1)) {
        *pIVar2 = 1;
      }
      if ((auVar4._12_4_ != auVar5._12_4_ || auVar4._8_4_ <= auVar5._8_4_) &&
          auVar4._12_4_ <= auVar5._12_4_) {
        pIVar2[-1] = 1;
      }
      uVar3 = uVar3 + 2;
      pIVar2 = pIVar2 + -2;
    } while ((bndim + 1U & 0xfffffffffffffffe) != uVar3);
    bndim = 0;
  }
  if (cndim != 0) {
    lVar1 = cndim + -1;
    auVar6._8_4_ = (int)lVar1;
    auVar6._0_8_ = lVar1;
    auVar6._12_4_ = (int)((ulong)lVar1 >> 0x20);
    pIVar2 = clo + cndim + -1;
    uVar3 = 0;
    auVar6 = auVar6 ^ _DAT_0020b020;
    do {
      auVar10._8_4_ = (int)uVar3;
      auVar10._0_8_ = uVar3;
      auVar10._12_4_ = (int)(uVar3 >> 0x20);
      auVar4 = (auVar10 | _DAT_0020b040) ^ _DAT_0020b020;
      if ((bool)(~(auVar4._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar4._0_4_ ||
                  auVar6._4_4_ < auVar4._4_4_) & 1)) {
        *pIVar2 = 1;
      }
      if ((auVar4._12_4_ != auVar6._12_4_ || auVar4._8_4_ <= auVar6._8_4_) &&
          auVar4._12_4_ <= auVar6._12_4_) {
        pIVar2[-1] = 1;
      }
      uVar3 = uVar3 + 2;
      pIVar2 = pIVar2 + -2;
    } while ((cndim + 1U & 0xfffffffffffffffe) != uVar3);
    cndim = 0;
  }
  if (mndim != 0) {
    lVar1 = mndim + -1;
    auVar7._8_4_ = (int)lVar1;
    auVar7._0_8_ = lVar1;
    auVar7._12_4_ = (int)((ulong)lVar1 >> 0x20);
    pIVar2 = mlo + mndim + -1;
    uVar3 = 0;
    auVar7 = auVar7 ^ _DAT_0020b020;
    do {
      auVar11._8_4_ = (int)uVar3;
      auVar11._0_8_ = uVar3;
      auVar11._12_4_ = (int)(uVar3 >> 0x20);
      auVar4 = (auVar11 | _DAT_0020b040) ^ _DAT_0020b020;
      if ((bool)(~(auVar4._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar4._0_4_ ||
                  auVar7._4_4_ < auVar4._4_4_) & 1)) {
        *pIVar2 = 1;
      }
      if ((auVar4._12_4_ != auVar7._12_4_ || auVar4._8_4_ <= auVar7._8_4_) &&
          auVar4._12_4_ <= auVar7._12_4_) {
        pIVar2[-1] = 1;
      }
      uVar3 = uVar3 + 2;
      pIVar2 = pIVar2 + -2;
    } while ((mndim + 1U & 0xfffffffffffffffe) != uVar3);
    mndim = 0;
  }
  _ga_sync_begin = 1;
  pnga_median_patch(g_a,alo,ahi,g_b,blo,bhi,g_c,clo,chi,g_m,mlo,mhi);
  return;
}

Assistant:

void pnga_median(Integer g_a, Integer g_b, Integer g_c, Integer g_m){


   Integer atype, andim;
   Integer alo[MAXDIM],ahi[MAXDIM];
   Integer btype, bndim;
   Integer blo[MAXDIM],bhi[MAXDIM];
   Integer ctype, cndim;
   Integer clo[MAXDIM],chi[MAXDIM];
   Integer mtype, mndim;
   Integer mlo[MAXDIM],mhi[MAXDIM];

    pnga_inquire(g_a,  &atype, &andim, ahi);
    pnga_inquire(g_b,  &btype, &bndim, bhi);
    pnga_inquire(g_c,  &ctype, &cndim, chi);
    pnga_inquire(g_m,  &mtype, &mndim, mhi);

    while(andim){
        alo[andim-1]=1;
        andim--;
    }

    while(bndim){
        blo[bndim-1]=1;
        bndim--;
    }

    while(cndim){
        clo[cndim-1]=1;
        cndim--;
    }

    while(mndim){
        mlo[mndim-1]=1;
        mndim--;
    }
    _ga_sync_begin = 1;
    pnga_median_patch(g_a, alo, ahi, g_b, blo, bhi, g_c, clo, chi, g_m, mlo, mhi);

}